

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O0

size_t secp256k1_bulletproof_innerproduct_proof_length(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  ulong in_RDI;
  size_t log;
  size_t bit_count;
  undefined8 local_8;
  
  if (in_RDI < 2) {
    local_8 = (in_RDI * 2 + 1) * 0x20;
  }
  else {
    sVar1 = secp256k1_popcountl(in_RDI);
    sVar2 = secp256k1_floor_lg((in_RDI << 1) >> 2);
    local_8 = (((sVar1 - 1) + sVar2) * 2 + 5) * 0x20 + (sVar2 * 2 + 7 >> 3);
  }
  return local_8;
}

Assistant:

size_t secp256k1_bulletproof_innerproduct_proof_length(size_t n) {
    if (n < IP_AB_SCALARS / 2) {
        return 32 * (1 + 2 * n);
    } else {
        size_t bit_count = secp256k1_popcountl(n);
        size_t log = secp256k1_floor_lg(2 * n / IP_AB_SCALARS);
        return 32 * (1 + 2 * (bit_count - 1 + log) + IP_AB_SCALARS) + (2*log + 7) / 8;
    }
}